

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O2

curl_slist * ADSBExchangeConnection::MakeCurlSList(string *theKey)

{
  undefined8 uVar1;
  curl_slist *pcVar2;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  uVar1 = curl_slist_append(0,"x-rapidapi-host: adsbexchange-com1.p.rapidapi.com");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"x-rapidapi-key: ",&local_59);
  std::operator+(&local_58,&local_38,theKey);
  pcVar2 = (curl_slist *)curl_slist_append(uVar1,local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pcVar2;
}

Assistant:

struct curl_slist* ADSBExchangeConnection::MakeCurlSList (const std::string theKey)
{
    struct curl_slist* slist = curl_slist_append(NULL, ADSBEX_RAPIDAPI_HOST);
    return curl_slist_append(slist, (std::string(ADSBEX_RAPIDAPI_KEY)+theKey).c_str());
}